

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O3

void __thiscall crypto::xchacha20::update(xchacha20 *this)

{
  word *keystream;
  word *pwVar1;
  word *pwVar2;
  word *pwVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  word wVar8;
  word wVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  
  keystream = this->keystream;
  uVar10 = *(undefined8 *)this->state;
  uVar11 = *(undefined8 *)(this->state + 2);
  uVar12 = *(undefined8 *)(this->state + 4);
  uVar13 = *(undefined8 *)(this->state + 6);
  uVar14 = *(undefined8 *)(this->state + 8);
  uVar15 = *(undefined8 *)(this->state + 10);
  uVar16 = *(undefined8 *)(this->state + 0xe);
  *(undefined8 *)(this->keystream + 0xc) = *(undefined8 *)(this->state + 0xc);
  *(undefined8 *)(this->keystream + 0xe) = uVar16;
  *(undefined8 *)(this->keystream + 8) = uVar14;
  *(undefined8 *)(this->keystream + 10) = uVar15;
  *(undefined8 *)(this->keystream + 4) = uVar12;
  *(undefined8 *)(this->keystream + 6) = uVar13;
  *(undefined8 *)this->keystream = uVar10;
  *(undefined8 *)(this->keystream + 2) = uVar11;
  run_rounds(keystream);
  lVar17 = 0;
  do {
    pwVar3 = this->state + lVar17;
    wVar4 = pwVar3[1];
    wVar5 = pwVar3[2];
    wVar6 = pwVar3[3];
    pwVar1 = keystream + lVar17;
    wVar7 = pwVar1[1];
    wVar8 = pwVar1[2];
    wVar9 = pwVar1[3];
    pwVar2 = keystream + lVar17;
    *pwVar2 = *pwVar1 + *pwVar3;
    pwVar2[1] = wVar7 + wVar4;
    pwVar2[2] = wVar8 + wVar5;
    pwVar2[3] = wVar9 + wVar6;
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x10);
  *(long *)(this->state + 0xc) = *(long *)(this->state + 0xc) + 1;
  return;
}

Assistant:

void xchacha20::update() {
	
	std::memcpy(keystream, state, sizeof(state));
	run_rounds(keystream);
	
	for(size_t i = 0; i < 16; i++) {
		keystream[i] += state[i];
	}
	
	increment_count(state);
	
}